

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writefile.cpp
# Opt level: O0

void __thiscall WriteFile::WriteUnbuffered(WriteFile *this,char *data,size_t writeSize)

{
  ssize_t sVar1;
  int *piVar2;
  ssize_t nWriten;
  size_t writeSize_local;
  char *data_local;
  WriteFile *this_local;
  
  nWriten = writeSize;
  writeSize_local = (size_t)data;
  do {
    while( true ) {
      if (nWriten == 0) {
        return;
      }
      sVar1 = write(this->m_fd,(void *)writeSize_local,nWriten);
      if (sVar1 < 0) break;
      nWriten = nWriten - sVar1;
      writeSize_local = sVar1 + writeSize_local;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  return;
}

Assistant:

void WriteFile::WriteUnbuffered(const char * data, size_t writeSize)
{
	while(0 < writeSize)
	{
		ssize_t nWriten = write(m_fd, data, writeSize);
		if (0 > nWriten)
		{
			// retry
			if (EINTR == errno)
			{
				continue;
			}
			return;
		}
		
		writeSize -= nWriten;
		data += nWriten;
	}
}